

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O1

bool nite::keyboardPressOnce(uint key)

{
  undefined1 uVar1;
  
  if (key < 100) {
    uVar1 = KeysCheck[key];
    KeysState[key] = false;
    KeysStatePressed[key] = false;
    isKeysStatePressed[key] = false;
    KeysCheck[key] = false;
  }
  else {
    uVar1 = 0;
  }
  return (bool)uVar1;
}

Assistant:

bool nite::keyboardPressOnce(unsigned key){
	if (key >= niteKeysn-1) return 0;
	bool b = KeysCheck[key];
	KeysState[key] = 0;
	KeysStatePressed[key] = 0;
	isKeysStatePressed[key] = 0;
	KeysCheck[key] = 0;
	return b;
}